

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

string * dtc::anon_unknown_3::dirbasename
                   (string *__return_storage_ptr__,function<char_*(char_*)> *fn,string *s)

{
  __type _Var1;
  char *__args;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  _Var1 = std::operator==(s,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (_Var1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __args = strdup((s->_M_dataplus)._M_p);
    __s = std::function<char_*(char_*)>::operator()(fn,__args);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_48);
    free(__args);
  }
  return __return_storage_ptr__;
}

Assistant:

string
dirbasename(std::function<char*(char*)> fn, const string &s)
{
	if (s == string())
	{
		return string();
	}
	std::unique_ptr<char, decltype(free)*> str = {strdup(s.c_str()), free};
	string dn(fn(str.get()));
	return dn;
}